

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void aom_highbd_h_predictor_64x32_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t uVar1;
  long lVar2;
  long lVar3;
  
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    uVar1 = left[lVar2];
    for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      dst[lVar3] = uVar1;
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void highbd_h_predictor(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int bd) {
  int r;
  (void)above;
  (void)bd;
  for (r = 0; r < bh; r++) {
    aom_memset16(dst, left[r], bw);
    dst += stride;
  }
}